

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int fmt::internal::CharTraits<char>::format_float<double>
              (char *buffer,size_t size,char *format,uint width,int precision,double value)

{
  uint in_ECX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  uint in_R8D;
  undefined8 in_XMM0_Qa;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_4;
  
  if (in_ECX == 0) {
    if ((int)in_R8D < 0) {
      local_34 = snprintf(in_RDI,in_RSI,in_RDX,in_XMM0_Qa);
    }
    else {
      local_34 = snprintf(in_RDI,in_RSI,in_RDX,in_XMM0_Qa,(ulong)in_R8D);
    }
    local_4 = local_34;
  }
  else {
    if ((int)in_R8D < 0) {
      local_38 = snprintf(in_RDI,in_RSI,in_RDX,in_XMM0_Qa,(ulong)in_ECX);
    }
    else {
      local_38 = snprintf(in_RDI,in_RSI,in_RDX,in_XMM0_Qa,(ulong)in_ECX,(ulong)in_R8D);
    }
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

int fmt::internal::CharTraits<char>::format_float(
    char *buffer, std::size_t size, const char *format,
    unsigned width, int precision, T value) {
  if (width == 0) {
    return precision < 0 ?
        FMT_SNPRINTF(buffer, size, format, value) :
        FMT_SNPRINTF(buffer, size, format, precision, value);
  }
  return precision < 0 ?
      FMT_SNPRINTF(buffer, size, format, width, value) :
      FMT_SNPRINTF(buffer, size, format, width, precision, value);
}